

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
               (double *begin,double *end,int param_3,ulong param_4)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong uVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  ulong uVar23;
  long lVar24;
  _DistanceType __len;
  ulong uVar25;
  double *pdVar26;
  bool bVar27;
  double __tmp;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  param_4 = param_4 & 0xffffffff;
  pdVar1 = end + -2;
  pdVar2 = end + -5;
  pdVar3 = end + -8;
  do {
    lVar20 = (long)end - (long)begin;
    if (lVar20 < 0x240) {
      pdVar22 = begin + 3;
      if ((param_4 & 1) == 0) {
        if (pdVar22 != end && begin != end) {
          pdVar18 = begin + 4;
          pdVar19 = begin;
          do {
            pdVar17 = pdVar22;
            dVar7 = pdVar19[3];
            if (*pdVar19 <= dVar7 && dVar7 != *pdVar19) {
              dVar12 = pdVar19[4];
              dVar13 = pdVar19[5];
              pdVar22 = pdVar18;
              do {
                pdVar19 = pdVar22;
                pdVar19[-1] = pdVar19[-4];
                *pdVar19 = pdVar19[-3];
                pdVar19[1] = pdVar19[-2];
                pdVar22 = pdVar19 + -3;
              } while (pdVar19[-7] <= dVar7 && dVar7 != pdVar19[-7]);
              pdVar19[-4] = dVar7;
              pdVar19[-3] = dVar12;
              pdVar19[-2] = dVar13;
            }
            pdVar22 = pdVar17 + 3;
            pdVar18 = pdVar18 + 3;
            pdVar19 = pdVar17;
          } while (pdVar22 != end);
        }
      }
      else if (pdVar22 != end && begin != end) {
        lVar20 = 0;
        pdVar18 = begin;
        do {
          pdVar19 = pdVar22;
          dVar7 = pdVar18[3];
          if (*pdVar18 <= dVar7 && dVar7 != *pdVar18) {
            dVar12 = pdVar18[4];
            dVar13 = pdVar18[5];
            lVar21 = lVar20;
            pdVar22 = pdVar19;
            do {
              pdVar18 = pdVar22;
              *pdVar18 = pdVar18[-3];
              pdVar18[1] = pdVar18[-2];
              pdVar18[2] = pdVar18[-1];
              pdVar22 = begin;
              if (lVar21 == 0) break;
              pdVar22 = pdVar18 + -3;
              lVar21 = lVar21 + 0x18;
            } while (pdVar18[-6] <= dVar7 && dVar7 != pdVar18[-6]);
            *pdVar22 = dVar7;
            pdVar18[-2] = dVar12;
            pdVar18[-1] = dVar13;
          }
          lVar20 = lVar20 + -0x18;
          pdVar22 = pdVar19 + 3;
          pdVar18 = pdVar19;
        } while (pdVar19 + 3 != end);
      }
LAB_002de31b:
      bVar27 = true;
    }
    else {
      uVar25 = (lVar20 >> 3) * -0x5555555555555555;
      uVar16 = uVar25 >> 1;
      pdVar22 = begin + uVar16 * 3;
      if (lVar20 < 0xc01) {
        dVar7 = *pdVar22;
        if (dVar7 < *begin) {
          *pdVar22 = *begin;
          *begin = dVar7;
          dVar7 = pdVar22[1];
          dVar12 = pdVar22[2];
          dVar13 = begin[2];
          pdVar22[1] = begin[1];
          pdVar22[2] = dVar13;
          begin[1] = dVar7;
          begin[2] = dVar12;
        }
        dVar7 = *begin;
        if (dVar7 < end[-3]) {
          *begin = end[-3];
          end[-3] = dVar7;
          dVar7 = begin[1];
          dVar12 = begin[2];
          dVar13 = end[-1];
          begin[1] = *pdVar1;
          begin[2] = dVar13;
          *pdVar1 = dVar7;
          end[-1] = dVar12;
        }
        dVar7 = *pdVar22;
        if (dVar7 < *begin) {
          *pdVar22 = *begin;
          *begin = dVar7;
          dVar7 = pdVar22[1];
          dVar12 = pdVar22[2];
          dVar13 = begin[2];
          pdVar22[1] = begin[1];
          pdVar22[2] = dVar13;
          begin[1] = dVar7;
          begin[2] = dVar12;
        }
      }
      else {
        dVar7 = *begin;
        if (dVar7 < *pdVar22) {
          *begin = *pdVar22;
          *pdVar22 = dVar7;
          dVar7 = begin[1];
          dVar12 = begin[2];
          dVar13 = pdVar22[2];
          begin[1] = pdVar22[1];
          begin[2] = dVar13;
          pdVar22[1] = dVar7;
          pdVar22[2] = dVar12;
        }
        dVar7 = *pdVar22;
        if (dVar7 < end[-3]) {
          *pdVar22 = end[-3];
          end[-3] = dVar7;
          dVar7 = pdVar22[1];
          dVar12 = pdVar22[2];
          dVar13 = end[-1];
          pdVar22[1] = *pdVar1;
          pdVar22[2] = dVar13;
          *pdVar1 = dVar7;
          end[-1] = dVar12;
        }
        dVar7 = *begin;
        if (dVar7 < *pdVar22) {
          *begin = *pdVar22;
          *pdVar22 = dVar7;
          dVar7 = begin[1];
          dVar12 = begin[2];
          dVar13 = pdVar22[2];
          begin[1] = pdVar22[1];
          begin[2] = dVar13;
          pdVar22[1] = dVar7;
          pdVar22[2] = dVar12;
        }
        pdVar18 = begin + uVar16 * 3 + -3;
        dVar7 = begin[3];
        if (dVar7 < *pdVar18) {
          begin[3] = *pdVar18;
          *pdVar18 = dVar7;
          dVar7 = begin[4];
          dVar12 = begin[5];
          dVar13 = pdVar18[2];
          begin[4] = pdVar18[1];
          begin[5] = dVar13;
          pdVar18[1] = dVar7;
          pdVar18[2] = dVar12;
        }
        dVar7 = *pdVar18;
        if (dVar7 < end[-6]) {
          *pdVar18 = end[-6];
          end[-6] = dVar7;
          dVar7 = pdVar18[1];
          dVar12 = pdVar18[2];
          dVar13 = end[-4];
          pdVar18[1] = *pdVar2;
          pdVar18[2] = dVar13;
          *pdVar2 = dVar7;
          end[-4] = dVar12;
        }
        dVar7 = begin[3];
        if (dVar7 < *pdVar18) {
          begin[3] = *pdVar18;
          *pdVar18 = dVar7;
          dVar7 = begin[4];
          dVar12 = begin[5];
          dVar13 = pdVar18[2];
          begin[4] = pdVar18[1];
          begin[5] = dVar13;
          pdVar18[1] = dVar7;
          pdVar18[2] = dVar12;
        }
        pdVar19 = begin + uVar16 * 3 + 3;
        dVar7 = begin[6];
        if (dVar7 < *pdVar19) {
          begin[6] = *pdVar19;
          *pdVar19 = dVar7;
          dVar7 = begin[7];
          dVar12 = begin[8];
          dVar13 = pdVar19[2];
          begin[7] = pdVar19[1];
          begin[8] = dVar13;
          pdVar19[1] = dVar7;
          pdVar19[2] = dVar12;
        }
        dVar7 = *pdVar19;
        if (dVar7 < end[-9]) {
          *pdVar19 = end[-9];
          end[-9] = dVar7;
          dVar7 = pdVar19[1];
          dVar12 = pdVar19[2];
          dVar13 = end[-7];
          pdVar19[1] = *pdVar3;
          pdVar19[2] = dVar13;
          *pdVar3 = dVar7;
          end[-7] = dVar12;
        }
        dVar7 = begin[6];
        if (dVar7 < *pdVar19) {
          begin[6] = *pdVar19;
          *pdVar19 = dVar7;
          dVar7 = begin[7];
          dVar12 = begin[8];
          dVar13 = pdVar19[2];
          begin[7] = pdVar19[1];
          begin[8] = dVar13;
          pdVar19[1] = dVar7;
          pdVar19[2] = dVar12;
        }
        dVar7 = *pdVar18;
        if (dVar7 < *pdVar22) {
          *pdVar18 = *pdVar22;
          *pdVar22 = dVar7;
          dVar7 = pdVar18[1];
          dVar12 = pdVar18[2];
          dVar13 = pdVar22[2];
          pdVar18[1] = pdVar22[1];
          pdVar18[2] = dVar13;
          pdVar22[1] = dVar7;
          pdVar22[2] = dVar12;
        }
        dVar7 = *pdVar22;
        if (dVar7 < *pdVar19) {
          *pdVar22 = *pdVar19;
          *pdVar19 = dVar7;
          dVar7 = pdVar22[1];
          dVar12 = pdVar22[2];
          dVar13 = pdVar19[2];
          pdVar22[1] = pdVar19[1];
          pdVar22[2] = dVar13;
          pdVar19[1] = dVar7;
          pdVar19[2] = dVar12;
        }
        dVar7 = *pdVar18;
        if (dVar7 < *pdVar22) {
          *pdVar18 = *pdVar22;
          *pdVar22 = dVar7;
          dVar7 = pdVar18[1];
          dVar12 = pdVar18[2];
          dVar13 = pdVar22[2];
          pdVar18[1] = pdVar22[1];
          pdVar18[2] = dVar13;
          pdVar22[1] = dVar7;
          pdVar22[2] = dVar12;
        }
        dVar7 = *begin;
        *begin = *pdVar22;
        *pdVar22 = dVar7;
        dVar7 = begin[1];
        dVar12 = begin[2];
        dVar13 = pdVar22[2];
        begin[1] = pdVar22[1];
        begin[2] = dVar13;
        pdVar22[1] = dVar7;
        pdVar22[2] = dVar12;
      }
      if (((param_4 & 1) != 0) || (*begin <= begin[-3] && begin[-3] != *begin)) {
        dVar7 = *begin;
        pdVar22 = begin + 1;
        dVar12 = begin[1];
        dVar13 = begin[2];
        lVar21 = 0;
        do {
          lVar24 = lVar21 + 0x18;
          lVar21 = lVar21 + 0x18;
        } while (dVar7 < *(double *)((long)begin + lVar24));
        pdVar18 = (double *)(lVar21 + (long)begin);
        pdVar19 = end;
        if (lVar21 == 0x18) {
          do {
            if (pdVar19 <= pdVar18) break;
            pdVar17 = pdVar19 + -3;
            pdVar19 = pdVar19 + -3;
          } while (*pdVar17 <= dVar7);
        }
        else {
          do {
            pdVar17 = pdVar19 + -3;
            pdVar19 = pdVar19 + -3;
          } while (*pdVar17 <= dVar7);
        }
        pdVar17 = pdVar19;
        pdVar26 = pdVar18;
        if (pdVar18 < pdVar19) {
          do {
            dVar8 = *pdVar26;
            *pdVar26 = *pdVar17;
            *pdVar17 = dVar8;
            dVar8 = pdVar26[1];
            dVar14 = pdVar26[2];
            dVar15 = pdVar17[2];
            pdVar26[1] = pdVar17[1];
            pdVar26[2] = dVar15;
            pdVar17[1] = dVar8;
            pdVar17[2] = dVar14;
            do {
              pdVar4 = pdVar26 + 3;
              pdVar26 = pdVar26 + 3;
            } while (dVar7 < *pdVar4);
            do {
              pdVar4 = pdVar17 + -3;
              pdVar17 = pdVar17 + -3;
            } while (*pdVar4 <= dVar7);
          } while (pdVar26 < pdVar17);
        }
        pdVar17 = pdVar26 + -3;
        *begin = pdVar26[-3];
        uVar9 = *(undefined4 *)((long)pdVar26 - 0xc);
        uVar10 = *(undefined4 *)(pdVar26 + -1);
        uVar11 = *(undefined4 *)((long)pdVar26 - 4);
        *(undefined4 *)pdVar22 = *(undefined4 *)(pdVar26 + -2);
        *(undefined4 *)((long)begin + 0xc) = uVar9;
        *(undefined4 *)(begin + 2) = uVar10;
        *(undefined4 *)((long)begin + 0x14) = uVar11;
        pdVar26[-3] = dVar7;
        local_48 = SUB84(dVar12,0);
        uStack_44 = (undefined4)((ulong)dVar12 >> 0x20);
        uStack_40 = SUB84(dVar13,0);
        uStack_3c = (undefined4)((ulong)dVar13 >> 0x20);
        *(undefined4 *)(pdVar26 + -2) = local_48;
        *(undefined4 *)((long)pdVar26 - 0xc) = uStack_44;
        *(undefined4 *)(pdVar26 + -1) = uStack_40;
        *(undefined4 *)((long)pdVar26 - 4) = uStack_3c;
        lVar24 = (long)pdVar17 - (long)begin;
        uVar23 = (lVar24 >> 3) * -0x5555555555555555;
        lVar21 = (long)end - (long)pdVar26;
        uVar16 = (lVar21 >> 3) * -0x5555555555555555;
        if (((long)uVar23 < (long)(uVar25 >> 3)) || ((long)uVar16 < (long)(uVar25 >> 3))) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            lVar21 = (long)((uVar25 - ((long)(uVar25 - 2) >> 0x3f)) + -2) >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,long,std::pair<double,HighsDomainChange>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::rootReducedCost()::__0>>
                        (begin,lVar21,uVar25);
              bVar27 = lVar21 != 0;
              lVar21 = lVar21 + -1;
              pdVar18 = end + -3;
            } while (bVar27);
            do {
              *pdVar18 = *begin;
              dVar7 = begin[2];
              pdVar18[1] = *pdVar22;
              pdVar18[2] = dVar7;
              lVar20 = lVar20 + -0x18;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,long,std::pair<double,HighsDomainChange>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::rootReducedCost()::__0>>
                        (begin,0,(lVar20 >> 3) * -0x5555555555555555);
              pdVar18 = pdVar18 + -3;
            } while (0x18 < lVar20);
            bVar27 = true;
            param_3 = 0;
            goto LAB_002deb7f;
          }
          if (0x228 < lVar24) {
            uVar23 = uVar23 >> 2;
            dVar7 = *begin;
            *begin = begin[uVar23 * 3];
            begin[uVar23 * 3] = dVar7;
            dVar7 = *pdVar22;
            dVar12 = begin[2];
            dVar13 = (begin + uVar23 * 3 + 1)[1];
            *pdVar22 = begin[uVar23 * 3 + 1];
            begin[2] = dVar13;
            begin[uVar23 * 3 + 1] = dVar7;
            (begin + uVar23 * 3 + 1)[1] = dVar12;
            dVar7 = pdVar26[-6];
            pdVar26[-6] = pdVar17[uVar23 * -3];
            pdVar17[uVar23 * -3] = dVar7;
            dVar7 = pdVar26[-5];
            dVar12 = pdVar26[-4];
            dVar13 = (pdVar26 + uVar23 * -3 + -2)[1];
            pdVar26[-5] = pdVar26[uVar23 * -3 + -2];
            pdVar26[-4] = dVar13;
            local_88 = SUB84(dVar7,0);
            uStack_84 = (undefined4)((ulong)dVar7 >> 0x20);
            uStack_80 = SUB84(dVar12,0);
            uStack_7c = (undefined4)((ulong)dVar12 >> 0x20);
            pdVar22 = pdVar26 + uVar23 * -3 + -2;
            *(undefined4 *)pdVar22 = local_88;
            *(undefined4 *)((long)pdVar22 + 4) = uStack_84;
            *(undefined4 *)(pdVar22 + 1) = uStack_80;
            *(undefined4 *)((long)pdVar22 + 0xc) = uStack_7c;
            if (0xc00 < lVar24) {
              dVar7 = begin[3];
              begin[3] = begin[uVar23 * 3 + 3];
              begin[uVar23 * 3 + 3] = dVar7;
              dVar7 = begin[4];
              dVar12 = begin[5];
              dVar13 = (begin + uVar23 * 3 + 4)[1];
              begin[4] = begin[uVar23 * 3 + 4];
              begin[5] = dVar13;
              begin[uVar23 * 3 + 4] = dVar7;
              (begin + uVar23 * 3 + 4)[1] = dVar12;
              dVar7 = begin[6];
              begin[6] = begin[uVar23 * 3 + 6];
              begin[uVar23 * 3 + 6] = dVar7;
              dVar7 = begin[7];
              dVar12 = begin[8];
              dVar13 = (begin + uVar23 * 3 + 7)[1];
              begin[7] = begin[uVar23 * 3 + 7];
              begin[8] = dVar13;
              begin[uVar23 * 3 + 7] = dVar7;
              (begin + uVar23 * 3 + 7)[1] = dVar12;
              uVar25 = ~uVar23;
              dVar7 = pdVar26[-9];
              pdVar26[-9] = pdVar17[uVar25 * 3];
              pdVar17[uVar25 * 3] = dVar7;
              dVar7 = pdVar26[-8];
              dVar12 = pdVar26[-7];
              dVar13 = (pdVar26 + uVar25 * 3 + -2)[1];
              pdVar26[-8] = pdVar26[uVar25 * 3 + -2];
              pdVar26[-7] = dVar13;
              pdVar26[uVar25 * 3 + -2] = dVar7;
              (pdVar26 + uVar25 * 3 + -2)[1] = dVar12;
              lVar20 = -2 - uVar23;
              dVar7 = pdVar26[-0xc];
              pdVar26[-0xc] = pdVar17[lVar20 * 3];
              pdVar17[lVar20 * 3] = dVar7;
              dVar7 = pdVar26[-0xb];
              dVar12 = pdVar26[-10];
              dVar13 = (pdVar26 + lVar20 * 3 + -2)[1];
              pdVar26[-0xb] = pdVar26[lVar20 * 3 + -2];
              pdVar26[-10] = dVar13;
              local_88 = SUB84(dVar7,0);
              uStack_84 = (undefined4)((ulong)dVar7 >> 0x20);
              uStack_80 = SUB84(dVar12,0);
              uStack_7c = (undefined4)((ulong)dVar12 >> 0x20);
              pdVar22 = pdVar26 + lVar20 * 3 + -2;
              *(undefined4 *)pdVar22 = local_88;
              *(undefined4 *)((long)pdVar22 + 4) = uStack_84;
              *(undefined4 *)(pdVar22 + 1) = uStack_80;
              *(undefined4 *)((long)pdVar22 + 0xc) = uStack_7c;
            }
          }
          if (0x228 < lVar21) {
            uVar16 = uVar16 >> 2;
            dVar7 = *pdVar26;
            *pdVar26 = pdVar26[uVar16 * 3];
            pdVar26[uVar16 * 3] = dVar7;
            dVar7 = pdVar26[1];
            dVar12 = pdVar26[2];
            dVar13 = (pdVar26 + uVar16 * 3 + 1)[1];
            pdVar26[1] = pdVar26[uVar16 * 3 + 1];
            pdVar26[2] = dVar13;
            pdVar26[uVar16 * 3 + 1] = dVar7;
            (pdVar26 + uVar16 * 3 + 1)[1] = dVar12;
            dVar7 = end[-3];
            end[-3] = end[uVar16 * -3];
            end[uVar16 * -3] = dVar7;
            dVar7 = *pdVar1;
            dVar12 = end[-1];
            dVar13 = (end + uVar16 * -3 + 1)[1];
            *pdVar1 = end[uVar16 * -3 + 1];
            end[-1] = dVar13;
            local_88 = SUB84(dVar7,0);
            uStack_84 = (undefined4)((ulong)dVar7 >> 0x20);
            uStack_80 = SUB84(dVar12,0);
            uStack_7c = (undefined4)((ulong)dVar12 >> 0x20);
            pdVar22 = end + uVar16 * -3 + 1;
            *(undefined4 *)pdVar22 = local_88;
            *(undefined4 *)((long)pdVar22 + 4) = uStack_84;
            *(undefined4 *)(pdVar22 + 1) = uStack_80;
            *(undefined4 *)((long)pdVar22 + 0xc) = uStack_7c;
            if (0xc00 < lVar21) {
              dVar7 = pdVar26[3];
              pdVar26[3] = pdVar26[uVar16 * 3 + 3];
              pdVar26[uVar16 * 3 + 3] = dVar7;
              dVar7 = pdVar26[4];
              dVar12 = pdVar26[5];
              dVar13 = (pdVar26 + uVar16 * 3 + 4)[1];
              pdVar26[4] = pdVar26[uVar16 * 3 + 4];
              pdVar26[5] = dVar13;
              pdVar26[uVar16 * 3 + 4] = dVar7;
              (pdVar26 + uVar16 * 3 + 4)[1] = dVar12;
              dVar7 = pdVar26[6];
              pdVar26[6] = pdVar26[uVar16 * 3 + 6];
              pdVar26[uVar16 * 3 + 6] = dVar7;
              dVar7 = pdVar26[7];
              dVar12 = pdVar26[8];
              dVar13 = (pdVar26 + uVar16 * 3 + 7)[1];
              pdVar26[7] = pdVar26[uVar16 * 3 + 7];
              pdVar26[8] = dVar13;
              pdVar26[uVar16 * 3 + 7] = dVar7;
              (pdVar26 + uVar16 * 3 + 7)[1] = dVar12;
              uVar25 = ~uVar16;
              dVar7 = end[-6];
              end[-6] = end[uVar25 * 3];
              end[uVar25 * 3] = dVar7;
              dVar7 = *pdVar2;
              dVar12 = end[-4];
              dVar13 = (end + uVar25 * 3 + 1)[1];
              *pdVar2 = end[uVar25 * 3 + 1];
              end[-4] = dVar13;
              end[uVar25 * 3 + 1] = dVar7;
              (end + uVar25 * 3 + 1)[1] = dVar12;
              lVar20 = -2 - uVar16;
              dVar7 = end[-9];
              end[-9] = end[lVar20 * 3];
              end[lVar20 * 3] = dVar7;
              dVar7 = *pdVar3;
              dVar12 = end[-7];
              dVar13 = (end + lVar20 * 3 + 1)[1];
              *pdVar3 = end[lVar20 * 3 + 1];
              end[-7] = dVar13;
              local_88 = SUB84(dVar7,0);
              uStack_84 = (undefined4)((ulong)dVar7 >> 0x20);
              uStack_80 = SUB84(dVar12,0);
              uStack_7c = (undefined4)((ulong)dVar12 >> 0x20);
              pdVar22 = end + lVar20 * 3 + 1;
              *(undefined4 *)pdVar22 = local_88;
              *(undefined4 *)((long)pdVar22 + 4) = uStack_84;
              *(undefined4 *)(pdVar22 + 1) = uStack_80;
              *(undefined4 *)((long)pdVar22 + 0xc) = uStack_7c;
            }
          }
        }
        else if (pdVar19 <= pdVar18) {
          if (begin == pdVar17) {
LAB_002dea2e:
            if (pdVar26 == end) goto LAB_002de31b;
            lVar20 = 0;
            uVar16 = 0;
            pdVar22 = pdVar26;
            do {
              if (pdVar22 + 3 == end) goto LAB_002de31b;
              dVar7 = pdVar22[3];
              if (*pdVar22 <= dVar7 && dVar7 != *pdVar22) {
                dVar12 = pdVar22[4];
                dVar13 = pdVar22[5];
                lVar21 = 0;
                do {
                  lVar24 = lVar21;
                  *(undefined8 *)((long)pdVar22 + lVar24 + 0x18) =
                       *(undefined8 *)((long)pdVar22 + lVar24);
                  puVar5 = (undefined4 *)((long)pdVar22 + lVar24 + 8);
                  uVar9 = puVar5[1];
                  uVar10 = puVar5[2];
                  uVar11 = puVar5[3];
                  puVar6 = (undefined4 *)((long)pdVar22 + lVar24 + 0x20);
                  *puVar6 = *puVar5;
                  puVar6[1] = uVar9;
                  puVar6[2] = uVar10;
                  puVar6[3] = uVar11;
                  if (lVar20 == lVar24) break;
                  pdVar18 = (double *)((long)pdVar22 + lVar24 + -0x18);
                  lVar21 = lVar24 + -0x18;
                } while (*pdVar18 <= dVar7 && dVar7 != *pdVar18);
                *(double *)((long)pdVar22 + lVar24) = dVar7;
                local_88 = SUB84(dVar12,0);
                uStack_84 = (undefined4)((ulong)dVar12 >> 0x20);
                uStack_80 = SUB84(dVar13,0);
                uStack_7c = (undefined4)((ulong)dVar13 >> 0x20);
                puVar5 = (undefined4 *)((long)pdVar22 + lVar24 + 8);
                *puVar5 = local_88;
                puVar5[1] = uStack_84;
                puVar5[2] = uStack_80;
                puVar5[3] = uStack_7c;
                uVar16 = uVar16 + (0x18 - lVar24 >> 3) * -0x5555555555555555;
              }
              lVar20 = lVar20 + -0x18;
              pdVar22 = pdVar22 + 3;
            } while (uVar16 < 9);
          }
          else {
            lVar20 = 0;
            uVar16 = 0;
            pdVar22 = begin;
            do {
              if (pdVar22 + 3 == pdVar17) goto LAB_002dea2e;
              dVar7 = pdVar22[3];
              if (*pdVar22 <= dVar7 && dVar7 != *pdVar22) {
                dVar12 = pdVar22[4];
                dVar13 = pdVar22[5];
                lVar21 = 0;
                do {
                  lVar24 = lVar21;
                  *(undefined8 *)((long)pdVar22 + lVar24 + 0x18) =
                       *(undefined8 *)((long)pdVar22 + lVar24);
                  puVar5 = (undefined4 *)((long)pdVar22 + lVar24 + 8);
                  uVar9 = puVar5[1];
                  uVar10 = puVar5[2];
                  uVar11 = puVar5[3];
                  puVar6 = (undefined4 *)((long)pdVar22 + lVar24 + 0x20);
                  *puVar6 = *puVar5;
                  puVar6[1] = uVar9;
                  puVar6[2] = uVar10;
                  puVar6[3] = uVar11;
                  if (lVar20 == lVar24) break;
                  pdVar18 = (double *)((long)pdVar22 + lVar24 + -0x18);
                  lVar21 = lVar24 + -0x18;
                } while (*pdVar18 <= dVar7 && dVar7 != *pdVar18);
                *(double *)((long)pdVar22 + lVar24) = dVar7;
                local_88 = SUB84(dVar12,0);
                uStack_84 = (undefined4)((ulong)dVar12 >> 0x20);
                uStack_80 = SUB84(dVar13,0);
                uStack_7c = (undefined4)((ulong)dVar13 >> 0x20);
                puVar5 = (undefined4 *)((long)pdVar22 + lVar24 + 8);
                *puVar5 = local_88;
                puVar5[1] = uStack_84;
                puVar5[2] = uStack_80;
                puVar5[3] = uStack_7c;
                uVar16 = uVar16 + (0x18 - lVar24 >> 3) * -0x5555555555555555;
              }
              lVar20 = lVar20 + -0x18;
              pdVar22 = pdVar22 + 3;
            } while (uVar16 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
                  (begin,pdVar17,param_3);
        bVar27 = false;
        param_4 = 0;
        begin = pdVar26;
      }
      else {
        dVar7 = *begin;
        dVar12 = begin[1];
        dVar13 = begin[2];
        lVar20 = 0;
        do {
          pdVar22 = (double *)((long)end + lVar20 + -0x18);
          lVar20 = lVar20 + -0x18;
        } while (*pdVar22 <= dVar7 && dVar7 != *pdVar22);
        pdVar22 = (double *)(lVar20 + (long)end);
        pdVar18 = begin;
        if (lVar20 == -0x18) {
          do {
            pdVar19 = pdVar18;
            if (pdVar22 <= pdVar18) break;
            pdVar19 = pdVar18 + 3;
            pdVar17 = pdVar18 + 3;
            pdVar18 = pdVar19;
          } while (dVar7 < *pdVar17 || dVar7 == *pdVar17);
        }
        else {
          do {
            pdVar19 = pdVar18 + 3;
            pdVar17 = pdVar18 + 3;
            pdVar18 = pdVar19;
          } while (dVar7 < *pdVar17 || dVar7 == *pdVar17);
        }
        while (pdVar19 < pdVar22) {
          dVar8 = *pdVar19;
          *pdVar19 = *pdVar22;
          *pdVar22 = dVar8;
          dVar8 = pdVar19[1];
          dVar14 = pdVar19[2];
          dVar15 = pdVar22[2];
          pdVar19[1] = pdVar22[1];
          pdVar19[2] = dVar15;
          pdVar22[1] = dVar8;
          pdVar22[2] = dVar14;
          do {
            pdVar18 = pdVar22 + -3;
            pdVar22 = pdVar22 + -3;
          } while (*pdVar18 <= dVar7 && dVar7 != *pdVar18);
          do {
            pdVar18 = pdVar19 + 3;
            pdVar19 = pdVar19 + 3;
          } while (dVar7 < *pdVar18 || dVar7 == *pdVar18);
        }
        *begin = *pdVar22;
        dVar8 = pdVar22[2];
        begin[1] = pdVar22[1];
        begin[2] = dVar8;
        *pdVar22 = dVar7;
        pdVar22[1] = dVar12;
        pdVar22[2] = dVar13;
        begin = pdVar22 + 3;
        bVar27 = false;
      }
    }
LAB_002deb7f:
    if (bVar27) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }